

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void kj::copyContents(Directory *to,ReadableDirectory *from)

{
  PathPtr fromPath;
  PathPtr toPath;
  String *pSVar1;
  size_t sVar2;
  size_t *name;
  long lVar3;
  long lVar4;
  Path subPath;
  Path local_78;
  long local_58;
  long lStack_50;
  undefined8 *local_48;
  String *local_40;
  size_t sStack_38;
  
  (*(from->super_FsNode)._vptr_FsNode[7])(&local_58);
  lVar3 = local_58;
  if (lStack_50 != 0) {
    name = (size_t *)(local_58 + 8);
    lVar4 = lStack_50 << 5;
    do {
      Path::Path(&local_78,(String *)name);
      toPath.parts.size_ = local_78.parts.size_;
      toPath.parts.ptr = local_78.parts.ptr;
      local_40 = local_78.parts.ptr;
      sStack_38 = local_78.parts.size_;
      fromPath.parts.size_ = local_78.parts.size_;
      fromPath.parts.ptr = local_78.parts.ptr;
      tryCopyDirectoryEntry(to,toPath,CREATE,from,fromPath,*(Type *)(name + -1),false);
      sVar2 = local_78.parts.size_;
      pSVar1 = local_78.parts.ptr;
      if (local_78.parts.ptr != (String *)0x0) {
        local_78.parts.ptr = (String *)0x0;
        local_78.parts.size_ = 0;
        (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
                  (local_78.parts.disposer,pSVar1,0x18,sVar2,sVar2,
                   ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
      name = name + 4;
      lVar4 = lVar4 + -0x20;
      lVar3 = local_58;
    } while (lVar4 != 0);
  }
  lVar4 = lStack_50;
  if (lVar3 != 0) {
    local_58 = 0;
    lStack_50 = 0;
    (**(code **)*local_48)
              (local_48,lVar3,0x20,lVar4,lVar4,
               ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct);
  }
  return;
}

Assistant:

static void copyContents(const Directory& to, const ReadableDirectory& from) {
  for (auto& entry: from.listEntries()) {
    Path subPath(kj::mv(entry.name));
    tryCopyDirectoryEntry(to, subPath, WriteMode::CREATE, from, subPath, entry.type, false);
  }
}